

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

string * __thiscall
Parameter<std::pair<int,int>>::getParamType_abi_cxx11_(Parameter<std::pair<int,_int>_> *this)

{
  string *in_RDI;
  
  ParameterTraits<std::pair<int,int>>::getParamType_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }